

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O0

ion_status_t bpptree_get(ion_dictionary_t *dictionary,ion_key_t key,ion_value_t value)

{
  ion_status_t iVar1;
  ion_err_t iVar2;
  ion_bpp_err_t iVar3;
  ion_err_t err;
  ion_bpp_err_t bErr;
  ion_file_offset_t next;
  ion_file_offset_t offset;
  ion_bpptree_t *bpptree;
  ion_value_t value_local;
  ion_key_t key_local;
  ion_dictionary_t *dictionary_local;
  
  offset = (ion_file_offset_t)dictionary->instance;
  bpptree = (ion_bpptree_t *)value;
  value_local = key;
  key_local = dictionary;
  iVar3 = b_get(*(ion_bpp_handle_t *)(offset + 0x20),key,&next);
  if (iVar3 == bErrOk) {
    iVar2 = lfb_get((ion_lfb_t *)(offset + 0x28),next,*(uint *)(offset + 8),(ion_byte_t *)bpptree,
                    (ion_file_offset_t *)&stack0xffffffffffffffc0);
    if (iVar2 == '\0') {
      dictionary_local._0_4_ = (uint)dictionary_local._1_3_ << 8;
      dictionary_local._4_4_ = 1;
    }
    else {
      dictionary_local._0_4_ = CONCAT31(dictionary_local._1_3_,iVar2);
      dictionary_local._4_4_ = 0;
    }
  }
  else {
    dictionary_local._0_4_ = CONCAT31(dictionary_local._1_3_,1);
    dictionary_local._4_4_ = 0;
  }
  iVar1.count = dictionary_local._4_4_;
  iVar1._0_4_ = (int)dictionary_local;
  return iVar1;
}

Assistant:

ion_status_t
bpptree_get(
	ion_dictionary_t	*dictionary,
	ion_key_t			key,
	ion_value_t			value
) {
	ion_bpptree_t		*bpptree;
	ion_file_offset_t	offset;
	ion_file_offset_t	next;
	ion_bpp_err_t		bErr;
	ion_err_t			err;

	bpptree = (ion_bpptree_t *) dictionary->instance;

	bErr	= b_get(bpptree->tree, key, &offset);

	if (bErrOk != bErr) {
		return ION_STATUS_ERROR(err_item_not_found);
	}

	err = lfb_get(&(bpptree->values), offset, bpptree->super.record.value_size, (ion_byte_t *) value, &next);

	if (err_ok == err) {
		return ION_STATUS_OK(1);
	}

	return ION_STATUS_ERROR(err);
}